

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

char * ucnv_io_stripEBCDICForCompare_63(char *dst,char *name)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint uVar6;
  char *dstItr;
  
  pcVar3 = dst;
  bVar1 = *name;
  if (bVar1 != 0) {
    bVar2 = false;
    do {
      uVar6 = (uint)bVar1;
      bVar2 = !bVar2;
      while( true ) {
        name = (char *)((byte *)name + 1);
        uVar4 = (uint8_t)uVar6;
        if (((char)uVar4 < '\0') && (uVar5 = ""[uVar6 & 0x7f], uVar5 != '\0')) break;
        uVar6 = (uint)(byte)*name;
LAB_001cfed7:
        bVar2 = true;
        if ((char)uVar6 == '\0') goto LAB_001cff0f;
      }
      if (uVar5 != '\x01') {
        if (uVar5 != '\x02') {
          bVar2 = false;
          goto LAB_001cfefd;
        }
LAB_001cfeed:
        bVar2 = true;
        uVar5 = uVar4;
        goto LAB_001cfefd;
      }
      if (!bVar2) goto LAB_001cfeed;
      uVar6 = (uint)(byte)*name;
      if ((*name < '\0') && (""[uVar6 & 0x7f] - 1 < 2)) goto LAB_001cfed7;
      bVar2 = false;
      uVar5 = uVar4;
LAB_001cfefd:
      *dst = uVar5;
      dst = (char *)((uint8_t *)dst + 1);
      bVar1 = *name;
    } while (bVar1 != 0);
  }
LAB_001cff0f:
  *dst = '\0';
  return pcVar3;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripEBCDICForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_EBCDIC_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_EBCDIC_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}